

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aescrypt2.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  uchar *input;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  mbedtls_md_info_t *md_info;
  FILE *__stream;
  size_t sVar5;
  ulong uVar6;
  uint local_808;
  uint local_804;
  uchar tmp [16];
  off_t offset;
  off_t filesize;
  mbedtls_md_context_t sha_ctx;
  mbedtls_aes_context aes_ctx;
  byte abStack_688 [7];
  uchar diff;
  uchar buffer [1024];
  uchar digest [32];
  uchar key [512];
  uchar IV [16];
  char *p;
  FILE *fout;
  FILE *fin;
  FILE *fkey;
  size_t keylen;
  int lastn;
  int mode;
  uint n;
  uint i;
  int ret;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  n = 1;
  fout = (FILE *)0x0;
  p = (char *)0x0;
  _i = argv;
  argv_local._0_4_ = argc;
  mbedtls_aes_init((mbedtls_aes_context *)&sha_ctx.hmac_ctx);
  mbedtls_md_init((mbedtls_md_context_t *)&filesize);
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
  n = mbedtls_md_setup((mbedtls_md_context_t *)&filesize,md_info,1);
  if (n == 0) {
    if ((int)argv_local == 5) {
      iVar3 = atoi(_i[1]);
      memset(key + 0x1f8,0,0x10);
      memset(digest + 0x18,0,0x200);
      memset(buffer + 0x3f8,0,0x20);
      memset(abStack_688,0,0x400);
      if ((iVar3 == 0) || (iVar3 == 1)) {
        iVar4 = strcmp(_i[2],_i[3]);
        if (iVar4 == 0) {
          fprintf(_stderr,"input and output filenames must differ\n");
        }
        else {
          fout = (FILE *)fopen(_i[2],"rb");
          if ((FILE *)fout == (FILE *)0x0) {
            fprintf(_stderr,"fopen(%s,rb) failed\n",_i[2]);
          }
          else {
            p = (char *)fopen(_i[3],"wb+");
            if ((FILE *)p == (FILE *)0x0) {
              fprintf(_stderr,"fopen(%s,wb+) failed\n",_i[3]);
            }
            else {
              __stream = fopen(_i[4],"rb");
              if (__stream == (FILE *)0x0) {
                if (*(int *)_i[4] == 0x3a786568) {
                  IV._8_8_ = _i[4] + 4;
                  for (fkey = (FILE *)0x0; iVar4 = __isoc99_sscanf(IV._8_8_,"%02X",&lastn),
                      0 < iVar4 && fkey < (FILE *)0x200; fkey = (FILE *)((long)&fkey->_flags + 1)) {
                    (digest + 0x18)[(long)fkey] = (uchar)lastn;
                    IV._8_8_ = IV._8_8_ + 2;
                  }
                }
                else {
                  fkey = (FILE *)strlen(_i[4]);
                  if ((FILE *)0x200 < fkey) {
                    fkey = (FILE *)0x200;
                  }
                  memcpy(digest + 0x18,_i[4],(size_t)fkey);
                }
              }
              else {
                fkey = (FILE *)fread(digest + 0x18,1,0x200,__stream);
                fclose(__stream);
              }
              __s = _i[4];
              sVar5 = strlen(_i[4]);
              memset(__s,0,sVar5);
              iVar4 = fileno((FILE *)fout);
              uVar6 = lseek(iVar4,0,2);
              if ((long)uVar6 < 0) {
                perror("lseek");
              }
              else {
                iVar4 = fseek((FILE *)fout,0,0);
                if (iVar4 < 0) {
                  fprintf(_stderr,"fseek(0,SEEK_SET) failed\n");
                }
                else {
                  if (iVar3 == 0) {
                    for (mode = 0; (uint)mode < 8; mode = mode + 1) {
                      buffer[(ulong)(uint)mode - 8] =
                           (uchar)((long)uVar6 >> ((byte)(mode << 3) & 0x3f));
                    }
                    input = (uchar *)_i[2];
                    mbedtls_md_starts((mbedtls_md_context_t *)&filesize);
                    mbedtls_md_update((mbedtls_md_context_t *)&filesize,abStack_688,8);
                    sVar5 = strlen((char *)input);
                    mbedtls_md_update((mbedtls_md_context_t *)&filesize,input,sVar5);
                    mbedtls_md_finish((mbedtls_md_context_t *)&filesize,buffer + 0x3f8);
                    key[0x1f8] = buffer[0x3f8];
                    key[0x1f9] = buffer[0x3f9];
                    key[0x1fa] = buffer[0x3fa];
                    key[0x1fb] = buffer[0x3fb];
                    key[0x1fc] = buffer[0x3fc];
                    key[0x1fd] = buffer[0x3fd];
                    key[0x1fe] = buffer[0x3fe];
                    key[0x1ff] = buffer[0x3ff];
                    IV[7] = SUB81(digest._0_8_,7);
                    IV._0_7_ = (undefined7)digest._0_8_;
                    sVar5 = fwrite(key + 0x1f8,1,0x10,(FILE *)p);
                    if (sVar5 != 0x10) {
                      fprintf(_stderr,"fwrite(%d bytes) failed\n",0x10);
                      goto LAB_00103ddf;
                    }
                    memset(buffer + 0x3f8,0,0x20);
                    buffer[0x3f8] = key[0x1f8];
                    buffer[0x3f9] = key[0x1f9];
                    buffer[0x3fa] = key[0x1fa];
                    buffer[0x3fb] = key[0x1fb];
                    buffer[0x3fc] = key[0x1fc];
                    buffer[0x3fd] = key[0x1fd];
                    buffer[0x3fe] = key[0x1fe];
                    buffer[0x3ff] = key[0x1ff];
                    digest[0] = IV[0];
                    digest[1] = IV[1];
                    digest[2] = IV[2];
                    digest[3] = IV[3];
                    digest[4] = IV[4];
                    digest[5] = IV[5];
                    digest[6] = IV[6];
                    digest[7] = IV[7] & 0xf0 | (byte)uVar6 & 0xf;
                    for (mode = 0; (uint)mode < 0x2000; mode = mode + 1) {
                      mbedtls_md_starts((mbedtls_md_context_t *)&filesize);
                      mbedtls_md_update((mbedtls_md_context_t *)&filesize,buffer + 0x3f8,0x20);
                      mbedtls_md_update((mbedtls_md_context_t *)&filesize,digest + 0x18,(size_t)fkey
                                       );
                      mbedtls_md_finish((mbedtls_md_context_t *)&filesize,buffer + 0x3f8);
                    }
                    memset(digest + 0x18,0,0x200);
                    mbedtls_aes_setkey_enc
                              ((mbedtls_aes_context *)&sha_ctx.hmac_ctx,buffer + 0x3f8,0x100);
                    mbedtls_md_hmac_starts((mbedtls_md_context_t *)&filesize,buffer + 0x3f8,0x20);
                    tmp[8] = '\0';
                    tmp[9] = '\0';
                    tmp[10] = '\0';
                    tmp[0xb] = '\0';
                    tmp[0xc] = '\0';
                    tmp[0xd] = '\0';
                    tmp[0xe] = '\0';
                    tmp[0xf] = '\0';
                    for (; (long)tmp._8_8_ < (long)uVar6; tmp._8_8_ = tmp._8_8_ + 0x10) {
                      if ((long)(uVar6 - tmp._8_8_) < 0x11) {
                        local_804 = (int)uVar6 - (int)tmp._8_8_;
                      }
                      else {
                        local_804 = 0x10;
                      }
                      lastn = local_804;
                      sVar5 = fread(abStack_688,1,(ulong)local_804,(FILE *)fout);
                      if (sVar5 != (uint)lastn) {
                        fprintf(_stderr,"fread(%d bytes) failed\n",(ulong)(uint)lastn);
                        goto LAB_00103ddf;
                      }
                      for (mode = 0; (uint)mode < 0x10; mode = mode + 1) {
                        buffer[(ulong)(uint)mode - 8] =
                             buffer[(ulong)(uint)mode - 8] ^ key[(ulong)(uint)mode + 0x1f8];
                      }
                      mbedtls_aes_crypt_ecb
                                ((mbedtls_aes_context *)&sha_ctx.hmac_ctx,1,abStack_688,abStack_688)
                      ;
                      mbedtls_md_hmac_update((mbedtls_md_context_t *)&filesize,abStack_688,0x10);
                      sVar5 = fwrite(abStack_688,1,0x10,(FILE *)p);
                      if (sVar5 != 0x10) {
                        fprintf(_stderr,"fwrite(%d bytes) failed\n",0x10);
                        goto LAB_00103ddf;
                      }
                      key[0x1f8] = abStack_688[0];
                      key[0x1f9] = abStack_688[1];
                      key[0x1fa] = abStack_688[2];
                      key[0x1fb] = abStack_688[3];
                      key[0x1fc] = abStack_688[4];
                      key[0x1fd] = abStack_688[5];
                      key[0x1fe] = abStack_688[6];
                      key[0x1ff] = diff;
                    }
                    mbedtls_md_hmac_finish((mbedtls_md_context_t *)&filesize,buffer + 0x3f8);
                    sVar5 = fwrite(buffer + 0x3f8,1,0x20,(FILE *)p);
                    if (sVar5 != 0x20) {
                      fprintf(_stderr,"fwrite(%d bytes) failed\n",0x10);
                      goto LAB_00103ddf;
                    }
                  }
                  if (iVar3 == 1) {
                    if ((long)uVar6 < 0x30) {
                      fprintf(_stderr,"File too short to be encrypted.\n");
                      goto LAB_00103ddf;
                    }
                    if ((uVar6 & 0xf) != 0) {
                      fprintf(_stderr,"File size not a multiple of 16.\n");
                      goto LAB_00103ddf;
                    }
                    sVar5 = fread(abStack_688,1,0x10,(FILE *)fout);
                    if (sVar5 != 0x10) {
                      fprintf(_stderr,"fread(%d bytes) failed\n",0x10);
                      goto LAB_00103ddf;
                    }
                    key[0x1f8] = abStack_688[0];
                    key[0x1f9] = abStack_688[1];
                    key[0x1fa] = abStack_688[2];
                    key[0x1fb] = abStack_688[3];
                    key[0x1fc] = abStack_688[4];
                    key[0x1fd] = abStack_688[5];
                    key[0x1fe] = abStack_688[6];
                    key[0x1ff] = diff;
                    IV[7] = SUB81(buffer._0_8_,7);
                    memset(buffer + 0x3f8,0,0x20);
                    buffer[0x3f8] = key[0x1f8];
                    buffer[0x3f9] = key[0x1f9];
                    buffer[0x3fa] = key[0x1fa];
                    buffer[0x3fb] = key[0x1fb];
                    buffer[0x3fc] = key[0x1fc];
                    buffer[0x3fd] = key[0x1fd];
                    buffer[0x3fe] = key[0x1fe];
                    buffer[0x3ff] = key[0x1ff];
                    digest[0] = buffer[0];
                    digest[1] = buffer[1];
                    digest[2] = buffer[2];
                    digest[3] = buffer[3];
                    digest[4] = buffer[4];
                    digest[5] = buffer[5];
                    digest[6] = buffer[6];
                    digest[7] = buffer[7];
                    for (mode = 0; (uint)mode < 0x2000; mode = mode + 1) {
                      mbedtls_md_starts((mbedtls_md_context_t *)&filesize);
                      mbedtls_md_update((mbedtls_md_context_t *)&filesize,buffer + 0x3f8,0x20);
                      mbedtls_md_update((mbedtls_md_context_t *)&filesize,digest + 0x18,(size_t)fkey
                                       );
                      mbedtls_md_finish((mbedtls_md_context_t *)&filesize,buffer + 0x3f8);
                    }
                    memset(digest + 0x18,0,0x200);
                    mbedtls_aes_setkey_dec
                              ((mbedtls_aes_context *)&sha_ctx.hmac_ctx,buffer + 0x3f8,0x100);
                    mbedtls_md_hmac_starts((mbedtls_md_context_t *)&filesize,buffer + 0x3f8,0x20);
                    tmp[8] = '\0';
                    tmp[9] = '\0';
                    tmp[10] = '\0';
                    tmp[0xb] = '\0';
                    tmp[0xc] = '\0';
                    tmp[0xd] = '\0';
                    tmp[0xe] = '\0';
                    tmp[0xf] = '\0';
                    for (; (long)tmp._8_8_ < (long)(uVar6 - 0x30); tmp._8_8_ = tmp._8_8_ + 0x10) {
                      sVar5 = fread(abStack_688,1,0x10,(FILE *)fout);
                      uVar1 = _abStack_688;
                      if (sVar5 != 0x10) {
                        fprintf(_stderr,"fread(%d bytes) failed\n",0x10);
                        goto LAB_00103ddf;
                      }
                      mbedtls_md_hmac_update((mbedtls_md_context_t *)&filesize,abStack_688,0x10);
                      mbedtls_aes_crypt_ecb
                                ((mbedtls_aes_context *)&sha_ctx.hmac_ctx,0,abStack_688,abStack_688)
                      ;
                      for (mode = 0; uVar2 = _abStack_688, (uint)mode < 0x10; mode = mode + 1) {
                        buffer[(ulong)(uint)mode - 8] =
                             buffer[(ulong)(uint)mode - 8] ^ key[(ulong)(uint)mode + 0x1f8];
                      }
                      abStack_688[0] = (byte)uVar1;
                      abStack_688[1] = SUB81(uVar1,1);
                      abStack_688[2] = SUB81(uVar1,2);
                      abStack_688[3] = SUB81(uVar1,3);
                      abStack_688[4] = SUB81(uVar1,4);
                      abStack_688[5] = SUB81(uVar1,5);
                      abStack_688[6] = SUB81(uVar1,6);
                      diff = SUB81(uVar1,7);
                      key[0x1f8] = abStack_688[0];
                      key[0x1f9] = abStack_688[1];
                      key[0x1fa] = abStack_688[2];
                      key[0x1fb] = abStack_688[3];
                      key[0x1fc] = abStack_688[4];
                      key[0x1fd] = abStack_688[5];
                      key[0x1fe] = abStack_688[6];
                      key[0x1ff] = diff;
                      if (((buffer._0_8_ & 0xf00000000000000) == 0) ||
                         (local_808 = IV[7] & 0xf, tmp._8_8_ != uVar6 - 0x40)) {
                        local_808 = 0x10;
                      }
                      lastn = local_808;
                      _abStack_688 = uVar2;
                      sVar5 = fwrite(abStack_688,1,(ulong)local_808,(FILE *)p);
                      if (sVar5 != (uint)lastn) {
                        fprintf(_stderr,"fwrite(%d bytes) failed\n",(ulong)(uint)lastn);
                        goto LAB_00103ddf;
                      }
                    }
                    mbedtls_md_hmac_finish((mbedtls_md_context_t *)&filesize,buffer + 0x3f8);
                    sVar5 = fread(abStack_688,1,0x20,(FILE *)fout);
                    if (sVar5 != 0x20) {
                      fprintf(_stderr,"fread(%d bytes) failed\n",0x20);
                      goto LAB_00103ddf;
                    }
                    aes_ctx.buf[0x43]._3_1_ = 0;
                    for (mode = 0; (uint)mode < 0x20; mode = mode + 1) {
                      aes_ctx.buf[0x43]._3_1_ =
                           aes_ctx.buf[0x43]._3_1_ |
                           buffer[(ulong)(uint)mode + 0x3f8] ^ buffer[(ulong)(uint)mode - 8];
                    }
                    if (aes_ctx.buf[0x43]._3_1_ != 0) {
                      fprintf(_stderr,"HMAC check failed: wrong key, or file corrupted.\n");
                      goto LAB_00103ddf;
                    }
                  }
                  n = 0;
                }
              }
            }
          }
        }
      }
      else {
        fprintf(_stderr,"invalide operation mode\n");
      }
    }
    else {
      printf(
            "\n  aescrypt2 <mode> <input filename> <output filename> <key>\n\n   <mode>: 0 = encrypt, 1 = decrypt\n\n  example: aescrypt2 0 file file.aes hex:E76B2413958B00E193\n\n"
            );
    }
  }
  else {
    printf("  ! mbedtls_md_setup() returned -0x%04x\n");
  }
LAB_00103ddf:
  if (fout != (FILE *)0x0) {
    fclose((FILE *)fout);
  }
  if (p != (char *)0x0) {
    fclose((FILE *)p);
  }
  memset(abStack_688,0,0x400);
  memset(buffer + 0x3f8,0,0x20);
  mbedtls_aes_free((mbedtls_aes_context *)&sha_ctx.hmac_ctx);
  mbedtls_md_free((mbedtls_md_context_t *)&filesize);
  return n;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;

    unsigned int i, n;
    int mode, lastn;
    size_t keylen;
    FILE *fkey, *fin = NULL, *fout = NULL;

    char *p;
    unsigned char IV[16];
    unsigned char key[512];
    unsigned char digest[32];
    unsigned char buffer[1024];
    unsigned char diff;

    mbedtls_aes_context aes_ctx;
    mbedtls_md_context_t sha_ctx;

#if defined(_WIN32_WCE)
    long filesize, offset;
#elif defined(_WIN32)
       LARGE_INTEGER li_size;
    __int64 filesize, offset;
#else
      off_t filesize, offset;
#endif

    mbedtls_aes_init( &aes_ctx );
    mbedtls_md_init( &sha_ctx );

    ret = mbedtls_md_setup( &sha_ctx, mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ), 1 );
    if( ret != 0 )
    {
        mbedtls_printf( "  ! mbedtls_md_setup() returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * Parse the command-line arguments.
     */
    if( argc != 5 )
    {
        mbedtls_printf( USAGE );

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        goto exit;
    }

    mode = atoi( argv[1] );
    memset(IV, 0, sizeof(IV));
    memset(key, 0, sizeof(key));
    memset(digest, 0, sizeof(digest));
    memset(buffer, 0, sizeof(buffer));

    if( mode != MODE_ENCRYPT && mode != MODE_DECRYPT )
    {
        mbedtls_fprintf( stderr, "invalide operation mode\n" );
        goto exit;
    }

    if( strcmp( argv[2], argv[3] ) == 0 )
    {
        mbedtls_fprintf( stderr, "input and output filenames must differ\n" );
        goto exit;
    }

    if( ( fin = fopen( argv[2], "rb" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,rb) failed\n", argv[2] );
        goto exit;
    }

    if( ( fout = fopen( argv[3], "wb+" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,wb+) failed\n", argv[3] );
        goto exit;
    }

    /*
     * Read the secret key and clean the command line.
     */
    if( ( fkey = fopen( argv[4], "rb" ) ) != NULL )
    {
        keylen = fread( key, 1, sizeof( key ), fkey );
        fclose( fkey );
    }
    else
    {
        if( memcmp( argv[4], "hex:", 4 ) == 0 )
        {
            p = &argv[4][4];
            keylen = 0;

            while( sscanf( p, "%02X", &n ) > 0 &&
                   keylen < (int) sizeof( key ) )
            {
                key[keylen++] = (unsigned char) n;
                p += 2;
            }
        }
        else
        {
            keylen = strlen( argv[4] );

            if( keylen > (int) sizeof( key ) )
                keylen = (int) sizeof( key );

            memcpy( key, argv[4], keylen );
        }
    }

    memset( argv[4], 0, strlen( argv[4] ) );

#if defined(_WIN32_WCE)
    filesize = fseek( fin, 0L, SEEK_END );
#else
#if defined(_WIN32)
    /*
     * Support large files (> 2Gb) on Win32
     */
    li_size.QuadPart = 0;
    li_size.LowPart  =
        SetFilePointer( (HANDLE) _get_osfhandle( _fileno( fin ) ),
                        li_size.LowPart, &li_size.HighPart, FILE_END );

    if( li_size.LowPart == 0xFFFFFFFF && GetLastError() != NO_ERROR )
    {
        mbedtls_fprintf( stderr, "SetFilePointer(0,FILE_END) failed\n" );
        goto exit;
    }

    filesize = li_size.QuadPart;
#else
    if( ( filesize = lseek( fileno( fin ), 0, SEEK_END ) ) < 0 )
    {
        perror( "lseek" );
        goto exit;
    }
#endif
#endif

    if( fseek( fin, 0, SEEK_SET ) < 0 )
    {
        mbedtls_fprintf( stderr, "fseek(0,SEEK_SET) failed\n" );
        goto exit;
    }

    if( mode == MODE_ENCRYPT )
    {
        /*
         * Generate the initialization vector as:
         * IV = SHA-256( filesize || filename )[0..15]
         */
        for( i = 0; i < 8; i++ )
            buffer[i] = (unsigned char)( filesize >> ( i << 3 ) );

        p = argv[2];

        mbedtls_md_starts( &sha_ctx );
        mbedtls_md_update( &sha_ctx, buffer, 8 );
        mbedtls_md_update( &sha_ctx, (unsigned char *) p, strlen( p ) );
        mbedtls_md_finish( &sha_ctx, digest );

        memcpy( IV, digest, 16 );

        /*
         * The last four bits in the IV are actually used
         * to store the file size modulo the AES block size.
         */
        lastn = (int)( filesize & 0x0F );

        IV[15] = (unsigned char)
            ( ( IV[15] & 0xF0 ) | lastn );

        /*
         * Append the IV at the beginning of the output.
         */
        if( fwrite( IV, 1, 16, fout ) != 16 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &sha_ctx );
            mbedtls_md_update( &sha_ctx, digest, 32 );
            mbedtls_md_update( &sha_ctx, key, keylen );
            mbedtls_md_finish( &sha_ctx, digest );
        }

        memset( key, 0, sizeof( key ) );
        mbedtls_aes_setkey_enc( &aes_ctx, digest, 256 );
        mbedtls_md_hmac_starts( &sha_ctx, digest, 32 );

        /*
         * Encrypt and write the ciphertext.
         */
        for( offset = 0; offset < filesize; offset += 16 )
        {
            n = ( filesize - offset > 16 ) ? 16 : (int)
                ( filesize - offset );

            if( fread( buffer, 1, n, fin ) != (size_t) n )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", n );
                goto exit;
            }

            for( i = 0; i < 16; i++ )
                buffer[i] = (unsigned char)( buffer[i] ^ IV[i] );

            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, buffer, buffer );
            mbedtls_md_hmac_update( &sha_ctx, buffer, 16 );

            if( fwrite( buffer, 1, 16, fout ) != 16 )
            {
                mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
                goto exit;
            }

            memcpy( IV, buffer, 16 );
        }

        /*
         * Finally write the HMAC.
         */
        mbedtls_md_hmac_finish( &sha_ctx, digest );

        if( fwrite( digest, 1, 32, fout ) != 32 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }
    }

    if( mode == MODE_DECRYPT )
    {
        unsigned char tmp[16];

        /*
         *  The encrypted file must be structured as follows:
         *
         *        00 .. 15              Initialization Vector
         *        16 .. 31              AES Encrypted Block #1
         *           ..
         *      N*16 .. (N+1)*16 - 1    AES Encrypted Block #N
         *  (N+1)*16 .. (N+1)*16 + 32   HMAC-SHA-256(ciphertext)
         */
        if( filesize < 48 )
        {
            mbedtls_fprintf( stderr, "File too short to be encrypted.\n" );
            goto exit;
        }

        if( ( filesize & 0x0F ) != 0 )
        {
            mbedtls_fprintf( stderr, "File size not a multiple of 16.\n" );
            goto exit;
        }

        /*
         * Subtract the IV + HMAC length.
         */
        filesize -= ( 16 + 32 );

        /*
         * Read the IV and original filesize modulo 16.
         */
        if( fread( buffer, 1, 16, fin ) != 16 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
            goto exit;
        }

        memcpy( IV, buffer, 16 );
        lastn = IV[15] & 0x0F;

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &sha_ctx );
            mbedtls_md_update( &sha_ctx, digest, 32 );
            mbedtls_md_update( &sha_ctx, key, keylen );
            mbedtls_md_finish( &sha_ctx, digest );
        }

        memset( key, 0, sizeof( key ) );
        mbedtls_aes_setkey_dec( &aes_ctx, digest, 256 );
        mbedtls_md_hmac_starts( &sha_ctx, digest, 32 );

        /*
         * Decrypt and write the plaintext.
         */
        for( offset = 0; offset < filesize; offset += 16 )
        {
            if( fread( buffer, 1, 16, fin ) != 16 )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
                goto exit;
            }

            memcpy( tmp, buffer, 16 );

            mbedtls_md_hmac_update( &sha_ctx, buffer, 16 );
            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_DECRYPT, buffer, buffer );

            for( i = 0; i < 16; i++ )
                buffer[i] = (unsigned char)( buffer[i] ^ IV[i] );

            memcpy( IV, tmp, 16 );

            n = ( lastn > 0 && offset == filesize - 16 )
                ? lastn : 16;

            if( fwrite( buffer, 1, n, fout ) != (size_t) n )
            {
                mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", n );
                goto exit;
            }
        }

        /*
         * Verify the message authentication code.
         */
        mbedtls_md_hmac_finish( &sha_ctx, digest );

        if( fread( buffer, 1, 32, fin ) != 32 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 32 );
            goto exit;
        }

        /* Use constant-time buffer comparison */
        diff = 0;
        for( i = 0; i < 32; i++ )
            diff |= digest[i] ^ buffer[i];

        if( diff != 0 )
        {
            mbedtls_fprintf( stderr, "HMAC check failed: wrong key, "
                             "or file corrupted.\n" );
            goto exit;
        }
    }

    ret = 0;

exit:
    if( fin )
        fclose( fin );
    if( fout )
        fclose( fout );

    memset( buffer, 0, sizeof( buffer ) );
    memset( digest, 0, sizeof( digest ) );

    mbedtls_aes_free( &aes_ctx );
    mbedtls_md_free( &sha_ctx );

    return( ret );
}